

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O0

sbfPub sbfPub_create(sbfTport tport,sbfQueue queue,char *topic0,sbfPubReadyCb readyCb,void *closure)

{
  sbfPub pub_00;
  char *pcVar1;
  sbfPubReadyCb in_RCX;
  sbfQueue in_RSI;
  sbfTportImpl *in_RDI;
  char *in_R8;
  sbfTopic topic;
  sbfPub pub;
  sbfPub pub_01;
  sbfPub local_8;
  
  pub_00 = (sbfPub)sbfTopic_create((sbfTopicType)((ulong)in_RCX >> 0x20),in_R8);
  if (pub_00 == (sbfPub)0x0) {
    local_8 = (sbfPub)0x0;
  }
  else {
    local_8 = (sbfPub)sbfMemory_calloc(1,0x168);
    local_8->mTopic = (sbfTopic)pub_00;
    local_8->mDestroyed = 0;
    sbfRefCount_init(&local_8->mRefCount,1);
    local_8->mReady = 0;
    local_8->mTport = in_RDI;
    local_8->mTportStream = (sbfTportStreamImpl *)0x0;
    local_8->mTportTopic = (sbfTportTopicImpl *)0x0;
    pub_01 = (sbfPub)in_RDI->mLog;
    pcVar1 = sbfTopic_getTopic(local_8->mTopic);
    sbfLog_log(pub_01,0,"creating publisher %p (%s)",local_8,pcVar1);
    local_8->mQueue = in_RSI;
    local_8->mReadyCb = in_RCX;
    local_8->mClosure = in_R8;
    sbfPubMakeHeader(pub_00);
    sbfPubSetStream(pub_01);
  }
  return local_8;
}

Assistant:

sbfPub
sbfPub_create (sbfTport tport,
               sbfQueue queue,
               const char* topic0,
               sbfPubReadyCb readyCb,
               void* closure)
{
    sbfPub   pub;
    sbfTopic topic;

    topic = sbfTopic_create (SBF_TOPIC_PUB, topic0);
    if (topic == NULL)
        return NULL;

    pub = xcalloc (1, sizeof *pub);
    pub->mTopic = topic;

    pub->mDestroyed = 0;
    sbfRefCount_init (&pub->mRefCount, 1);

    pub->mReady = 0;

    pub->mTport = tport;
    pub->mTportStream = NULL;
    pub->mTportTopic = NULL;

    sbfLog_debug (tport->mLog,
                  "creating publisher %p (%s)",
                  pub,
                  sbfTopic_getTopic (pub->mTopic));

    pub->mQueue = queue;
    pub->mReadyCb = readyCb;
    pub->mClosure = closure;

    sbfPubMakeHeader (pub);
    sbfPubSetStream (pub);

    return pub;
}